

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fixups.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::external_fixup::key(external_fixup *this,string *k)

{
  bool bVar1;
  error_code eVar2;
  reference local_78;
  reference local_68;
  reference local_58;
  reference local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *k_local;
  external_fixup *this_local;
  error_category *local_10;
  
  local_28 = k;
  k_local = (string *)this;
  bVar1 = std::operator==(k,"name");
  if (bVar1) {
    std::bitset<5UL>::operator[]((bitset<5UL> *)&local_38,(size_t)&this->seen_);
    std::bitset<5UL>::reference::operator=(&local_38,true);
    std::bitset<5UL>::reference::~reference(&local_38);
    eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->name_);
    local_10 = eVar2._M_cat;
    this_local._0_4_ = eVar2._M_value;
  }
  else {
    bVar1 = std::operator==(local_28,"type");
    if (bVar1) {
      std::bitset<5UL>::operator[]((bitset<5UL> *)&local_48,(size_t)&this->seen_);
      std::bitset<5UL>::reference::operator=(&local_48,true);
      std::bitset<5UL>::reference::~reference(&local_48);
      eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                        (&this->super_rule,&this->type_);
      local_10 = eVar2._M_cat;
      this_local._0_4_ = eVar2._M_value;
    }
    else {
      bVar1 = std::operator==(local_28,"is_weak");
      if (bVar1) {
        std::bitset<5UL>::operator[]((bitset<5UL> *)&local_58,(size_t)&this->seen_);
        std::bitset<5UL>::reference::operator=(&local_58,true);
        std::bitset<5UL>::reference::~reference(&local_58);
        eVar2 = rule::push<pstore::exchange::import_ns::bool_rule,bool*>
                          (&this->super_rule,&this->is_weak_);
        local_10 = eVar2._M_cat;
        this_local._0_4_ = eVar2._M_value;
      }
      else {
        bVar1 = std::operator==(local_28,"offset");
        if (bVar1) {
          std::bitset<5UL>::operator[]((bitset<5UL> *)&local_68,(size_t)&this->seen_);
          std::bitset<5UL>::reference::operator=(&local_68,true);
          std::bitset<5UL>::reference::~reference(&local_68);
          eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                            (&this->super_rule,&this->offset_);
          local_10 = eVar2._M_cat;
          this_local._0_4_ = eVar2._M_value;
        }
        else {
          bVar1 = std::operator==(local_28,"addend");
          if (bVar1) {
            std::bitset<5UL>::operator[]((bitset<5UL> *)&local_78,(size_t)&this->seen_);
            std::bitset<5UL>::reference::operator=(&local_78,true);
            std::bitset<5UL>::reference::~reference(&local_78);
            eVar2 = rule::push<pstore::exchange::import_ns::int64_rule,long*>
                              (&this->super_rule,&this->addend_);
            local_10 = eVar2._M_cat;
            this_local._0_4_ = eVar2._M_value;
          }
          else {
            std::error_code::error_code<pstore::exchange::import_ns::error,void>
                      ((error_code *)&this_local,unrecognized_xfixup_key);
          }
        }
      }
    }
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code external_fixup::key (std::string const & k) {
                if (k == "name") {
                    seen_[name_index] = true;
                    return this->push<uint64_rule> (&name_);
                }
                if (k == "type") {
                    seen_[type] = true;
                    return this->push<uint64_rule> (&type_);
                }
                if (k == "is_weak") {
                    seen_[is_weak] = true;
                    return this->push<bool_rule> (&is_weak_);
                }
                if (k == "offset") {
                    seen_[offset] = true;
                    return this->push<uint64_rule> (&offset_);
                }
                if (k == "addend") {
                    seen_[addend] = true;
                    return this->push<int64_rule> (&addend_);
                }
                return error::unrecognized_xfixup_key;
            }